

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcalendarwidget.cpp
# Opt level: O3

void QCalendarWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint *puVar1;
  code *pcVar2;
  long lVar3;
  undefined1 uVar4;
  uint uVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  SelectionMode *pSVar8;
  int iVar9;
  int year;
  QDate QVar10;
  QCalendarWidgetPrivate *this;
  long in_FS_OFFSET;
  undefined8 local_30;
  QDate local_28;
  undefined8 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
        return;
      }
      break;
    case 1:
      local_30 = *_a[1];
      iVar9 = 1;
      goto LAB_003cde35;
    case 2:
      local_30 = *_a[1];
      iVar9 = 2;
LAB_003cde35:
      local_20 = &local_30;
      local_28.jd = 0;
      QMetaObject::activate(_o,&staticMetaObject,iVar9,(void **)&local_28);
      goto switchD_003cd889_caseD_4;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        currentPageChanged((QCalendarWidget *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 4:
      pSVar8 = (SelectionMode *)_a[1];
switchD_003cd8f2_caseD_0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setSelectedDate((QCalendarWidget *)_o,(QDate)*(qint64 *)pSVar8);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setDateRange((QCalendarWidget *)_o,(QDate)*_a[1],(QDate)*_a[2]);
        return;
      }
      break;
    case 6:
      year = *_a[1];
      iVar9 = *_a[2];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_003cdf46:
        setCurrentPage((QCalendarWidget *)_o,year,iVar9);
        return;
      }
      break;
    case 7:
      pSVar8 = (SelectionMode *)_a[1];
switchD_003cd8f2_caseD_4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setGridVisible((QCalendarWidget *)_o,SUB41(*pSVar8,0));
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setNavigationBarVisible((QCalendarWidget *)_o,*_a[1]);
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        showNextMonth((QCalendarWidget *)_o);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        showPreviousMonth((QCalendarWidget *)_o);
        return;
      }
      break;
    case 0xb:
      iVar9 = *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0x3c);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        year = *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0x38) + 1;
        goto LAB_003cdf46;
      }
      break;
    case 0xc:
      iVar9 = *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0x3c);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        year = *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0x38) + -1;
        goto LAB_003cdf46;
      }
      break;
    case 0xd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        showSelectedDate((QCalendarWidget *)_o);
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        showToday((QCalendarWidget *)_o);
        return;
      }
      break;
    case 0xf:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCalendarWidgetPrivate::updateCurrentPage
                  (*(QCalendarWidgetPrivate **)(_o + 8),(QDate)*_a[1]);
        return;
      }
      break;
    case 0x10:
      this = *(QCalendarWidgetPrivate **)(_o + 8);
      QVar10.jd = *_a[1];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        uVar4 = true;
LAB_003cde7e:
        QCalendarWidgetPrivate::_q_slotChangeDate(this,QVar10,(bool)uVar4);
        return;
      }
      break;
    case 0x11:
      this = *(QCalendarWidgetPrivate **)(_o + 8);
      QVar10.jd = *_a[1];
      uVar4 = *_a[2];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) goto LAB_003cde7e;
      break;
    case 0x12:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCalendarWidgetPrivate::_q_editingFinished(*(QCalendarWidgetPrivate **)(_o + 8));
        return;
      }
      break;
    case 0x13:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCalendarWidgetPrivate::_q_prevMonthClicked(*(QCalendarWidgetPrivate **)(_o + 8));
        return;
      }
      break;
    case 0x14:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCalendarWidgetPrivate::_q_nextMonthClicked(*(QCalendarWidgetPrivate **)(_o + 8));
        return;
      }
      break;
    case 0x15:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCalendarWidgetPrivate::_q_yearEditingFinished(*(QCalendarWidgetPrivate **)(_o + 8));
        return;
      }
      break;
    case 0x16:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCalendarWidgetPrivate::_q_yearClicked(*(QCalendarWidgetPrivate **)(_o + 8));
        return;
      }
      break;
    case 0x17:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCalendarWidgetPrivate::_q_monthChanged(*(QCalendarWidgetPrivate **)(_o + 8),*_a[1]);
        return;
      }
      break;
    default:
      goto switchD_003cd889_caseD_4;
    }
    goto LAB_003ce02b;
  case ReadProperty:
    if (10 < (uint)_id) break;
    puVar1 = (uint *)*_a;
    switch(_id) {
    case 0:
      uVar7 = *(undefined8 *)(*(long *)(*(long *)(_o + 8) + 600) + 0x20);
      goto LAB_003cdc09;
    case 1:
      uVar7 = *(undefined8 *)(*(long *)(*(long *)(_o + 8) + 600) + 0x28);
      goto LAB_003cdc09;
    case 2:
      uVar7 = *(undefined8 *)(*(long *)(*(long *)(_o + 8) + 600) + 0x30);
LAB_003cdc09:
      *(undefined8 *)puVar1 = uVar7;
      goto switchD_003cd889_caseD_4;
    case 3:
      uVar5 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x40);
      break;
    case 4:
      uVar4 = QTableView::showGrid(*(QTableView **)(*(long *)(_o + 8) + 0x260));
      goto LAB_003cdc55;
    case 5:
      uVar5 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x28) ^ 1;
      break;
    case 6:
      uVar5 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x44);
      break;
    case 7:
      uVar5 = (uint)*(byte *)(*(long *)(*(long *)(_o + 8) + 600) + 0x48);
      break;
    case 8:
      uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x2d0);
      goto LAB_003cdc55;
    case 9:
      uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x280);
LAB_003cdc55:
      *(undefined1 *)puVar1 = uVar4;
      goto switchD_003cd889_caseD_4;
    case 10:
      uVar5 = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x278) + 0x38);
    }
    *puVar1 = uVar5;
    break;
  case WriteProperty:
    if ((uint)_id < 0xb) {
      pSVar8 = (SelectionMode *)*_a;
      switch(_id) {
      case 0:
        goto switchD_003cd8f2_caseD_0;
      case 1:
        QVar10.jd = *(qint64 *)pSVar8;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_003cd997:
          setMinimumDate((QCalendarWidget *)_o,QVar10);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setMaximumDate((QCalendarWidget *)_o,(QDate)*(qint64 *)pSVar8);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFirstDayOfWeek((QCalendarWidget *)_o,*pSVar8);
          return;
        }
        break;
      case 4:
        goto switchD_003cd8f2_caseD_4;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setSelectionMode((QCalendarWidget *)_o,*pSVar8);
          return;
        }
        break;
      case 6:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setHorizontalHeaderFormat((QCalendarWidget *)_o,*pSVar8);
          return;
        }
        break;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setVerticalHeaderFormat((QCalendarWidget *)_o,*pSVar8);
          return;
        }
        break;
      case 8:
        lVar3 = *(long *)(_o + 8);
        *(char *)(lVar3 + 0x2d0) = (char)*pSVar8;
        *(undefined8 *)(lVar3 + 0x2d4) = 0xffffffffffffffff;
        (**(code **)(**(long **)(lVar3 + 0x2c0) + 0x68))();
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QWidget::updateGeometry((QWidget *)_o);
          return;
        }
        break;
      case 9:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDateEditEnabled((QCalendarWidget *)_o,SUB41(*pSVar8,0));
          return;
        }
        break;
      case 10:
        *(SelectionMode *)(*(long *)(*(long *)(_o + 8) + 0x278) + 0x38) = *pSVar8;
        goto switchD_003cd889_caseD_4;
      }
      goto LAB_003ce02b;
    }
    break;
  case ResetProperty:
    if (_id == 2) {
      QDate::QDate(&local_28,9999,0xc,0x1f);
      setMaximumDate((QCalendarWidget *)_o,local_28);
    }
    else if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QVar10.jd = 1;
        goto LAB_003cd997;
      }
      goto LAB_003ce02b;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == selectionChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == clicked && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == activated && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == currentPageChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 3;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 0x17) {
      puVar6 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
        break;
      }
    }
    else {
      puVar6 = (undefined8 *)*_a;
    }
    *puVar6 = 0;
  }
switchD_003cd889_caseD_4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003ce02b:
  __stack_chk_fail();
}

Assistant:

void QCalendarWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCalendarWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->selectionChanged(); break;
        case 1: _t->clicked((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 2: _t->activated((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->currentPageChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->setSelectedDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->setDateRange((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDate>>(_a[2]))); break;
        case 6: _t->setCurrentPage((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 7: _t->setGridVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setNavigationBarVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 9: _t->showNextMonth(); break;
        case 10: _t->showPreviousMonth(); break;
        case 11: _t->showNextYear(); break;
        case 12: _t->showPreviousYear(); break;
        case 13: _t->showSelectedDate(); break;
        case 14: _t->showToday(); break;
        case 15: _t->d_func()->_q_slotShowDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 16: _t->d_func()->_q_slotChangeDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 17: _t->d_func()->_q_slotChangeDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 18: _t->d_func()->_q_editingFinished(); break;
        case 19: _t->d_func()->_q_prevMonthClicked(); break;
        case 20: _t->d_func()->_q_nextMonthClicked(); break;
        case 21: _t->d_func()->_q_yearEditingFinished(); break;
        case 22: _t->d_func()->_q_yearClicked(); break;
        case 23: _t->d_func()->_q_monthChanged((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 23:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)()>(_a, &QCalendarWidget::selectionChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(QDate )>(_a, &QCalendarWidget::clicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(QDate )>(_a, &QCalendarWidget::activated, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(int , int )>(_a, &QCalendarWidget::currentPageChanged, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QDate*>(_v) = _t->selectedDate(); break;
        case 1: *reinterpret_cast<QDate*>(_v) = _t->minimumDate(); break;
        case 2: *reinterpret_cast<QDate*>(_v) = _t->maximumDate(); break;
        case 3: *reinterpret_cast<Qt::DayOfWeek*>(_v) = _t->firstDayOfWeek(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isGridVisible(); break;
        case 5: *reinterpret_cast<SelectionMode*>(_v) = _t->selectionMode(); break;
        case 6: *reinterpret_cast<HorizontalHeaderFormat*>(_v) = _t->horizontalHeaderFormat(); break;
        case 7: *reinterpret_cast<VerticalHeaderFormat*>(_v) = _t->verticalHeaderFormat(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isNavigationBarVisible(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isDateEditEnabled(); break;
        case 10: *reinterpret_cast<int*>(_v) = _t->dateEditAcceptDelay(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSelectedDate(*reinterpret_cast<QDate*>(_v)); break;
        case 1: _t->setMinimumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 2: _t->setMaximumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 3: _t->setFirstDayOfWeek(*reinterpret_cast<Qt::DayOfWeek*>(_v)); break;
        case 4: _t->setGridVisible(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setSelectionMode(*reinterpret_cast<SelectionMode*>(_v)); break;
        case 6: _t->setHorizontalHeaderFormat(*reinterpret_cast<HorizontalHeaderFormat*>(_v)); break;
        case 7: _t->setVerticalHeaderFormat(*reinterpret_cast<VerticalHeaderFormat*>(_v)); break;
        case 8: _t->setNavigationBarVisible(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setDateEditEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setDateEditAcceptDelay(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->clearMinimumDate(); break;
        case 2: _t->clearMaximumDate(); break;
        default: break;
        }
    }
}